

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

opj_t1_t * t1_create_v2(void)

{
  opj_t1_t *t1;
  opj_mqc_t *poVar1;
  opj_raw_t *poVar2;
  
  t1 = (opj_t1_t *)malloc(0x40);
  if (t1 != (opj_t1_t *)0x0) {
    t1->datasize = 0;
    t1->flagssize = 0;
    *(undefined8 *)&t1->flags_stride = 0;
    t1->flags = (flag_t *)0x0;
    t1->w = 0;
    t1->h = 0;
    t1->raw = (opj_raw_t *)0x0;
    t1->data = (int *)0x0;
    t1->cinfo = (opj_common_ptr)0x0;
    t1->mqc = (opj_mqc_t *)0x0;
    poVar1 = mqc_create();
    t1->mqc = poVar1;
    if (poVar1 != (opj_mqc_t *)0x0) {
      poVar2 = raw_create();
      t1->raw = poVar2;
      if (poVar2 != (opj_raw_t *)0x0) {
        return t1;
      }
    }
    t1_destroy(t1);
  }
  return (opj_t1_t *)0x0;
}

Assistant:

opj_t1_t* t1_create_v2()
{
	opj_t1_t *l_t1 = 00;

	l_t1 = (opj_t1_t*) opj_malloc(sizeof(opj_t1_t));
	if
		(!l_t1)
	{
		return 00;
	}
	memset(l_t1,0,sizeof(opj_t1_t));

	/* create MQC and RAW handles */
	l_t1->mqc = mqc_create();
	if
		(! l_t1->mqc)
	{
		t1_destroy(l_t1);
		return 00;
	}
	l_t1->raw = raw_create();
	if
		(! l_t1->raw)
	{
		t1_destroy(l_t1);
		return 00;
	}
	return l_t1;
}